

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMate.cpp
# Opt level: O2

void __thiscall
chrono::ChLinkMateOrthogonal::ArchiveIN(ChLinkMateOrthogonal *this,ChArchiveIn *marchive)

{
  ChNameValue<chrono::ChVector<double>_> local_48;
  ChNameValue<chrono::ChVector<double>_> local_30;
  
  ChArchiveIn::VersionRead<chrono::ChLinkMateOrthogonal>(marchive);
  ChLinkMateGeneric::ArchiveIN(&this->super_ChLinkMateGeneric,marchive);
  local_30._value = &this->reldir1;
  local_30._name = "reldir1";
  local_30._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_30);
  local_48._value = &this->reldir2;
  local_48._name = "reldir2";
  local_48._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_48);
  return;
}

Assistant:

void ChLinkMateOrthogonal::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkMateOrthogonal>();

    // deserialize parent class
    ChLinkMateGeneric::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(reldir1);
    marchive >> CHNVP(reldir2);
}